

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1109b::FragmentURITest_ParseMultipleRange_Test::
~FragmentURITest_ParseMultipleRange_Test(FragmentURITest_ParseMultipleRange_Test *this)

{
  void *in_RDI;
  
  ~FragmentURITest_ParseMultipleRange_Test((FragmentURITest_ParseMultipleRange_Test *)0x12a1f8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST_F(FragmentURITest, ParseMultipleRange) {
    EXPECT_EQ(ktx::parseFragmentURI("m=0,0&a=1,1").mip, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("m=0,0&a=1,1").stratal, ktx::SelectorRange(1, 2));
    EXPECT_EQ(ktx::parseFragmentURI("a=0,0&f=1,1").stratal, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("a=0,0&f=1,1").facial, ktx::SelectorRange(1, 2));
    EXPECT_EQ(ktx::parseFragmentURI("f=0,0&m=1,1").facial, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("f=0,0&m=1,1").mip, ktx::SelectorRange(1, 2));
}